

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O1

int __thiscall CRNTOCommand::doWhat(CRNTOCommand *this,CClient *pClient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EFTPSTATE EVar2;
  int iVar3;
  string ret;
  string local_48;
  
  EVar2 = CClient::GetClientState(pClient);
  if ((int)EVar2 < 4) {
    EVar2 = CClient::GetClientState(pClient);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if ((int)EVar2 < 3) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"530 Please login with USER and PASS.\r\n","");
      CClient::sendMsg(pClient,&local_48);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"503 RNFR required first.\r\n","");
      CClient::sendMsg(pClient,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar1) {
      return -1;
    }
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&local_48,pClient);
    chdir(local_48._M_dataplus._M_p);
    paVar1 = &local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    CClient::GetClientLastFileName_abi_cxx11_(&local_48,pClient);
    iVar3 = rename(local_48._M_dataplus._M_p,(this->super_CCommand).m_Args._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (iVar3 == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"250 Rename successful.\r\n","");
      CClient::sendMsg(pClient,&local_48);
      CClient::SetClientState(pClient,PASS);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      return 1;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"550 Rename failed.\r\n","")
    ;
    CClient::sendMsg(pClient,&local_48);
    CClient::SetClientState(pClient,PASS);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar1) {
      return -1;
    }
  }
  operator_delete(local_48._M_dataplus._M_p);
  return -1;
}

Assistant:

int CRNTOCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= RNFR) {
        chdir(pClient->GetUserDir().c_str());
        if(0 == rename(pClient->GetClientLastFileName().c_str(),m_Args.c_str())){
            string ret = "250 Rename successful.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return 1;
        }
        else{
            string ret = "550 Rename failed.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return -1;
        }
    }
    else if(pClient->GetClientState() >= PASS){
        string ret = "503 RNFR required first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}